

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

Status * __thiscall
draco::ObjDecoder::DecodeFromBuffer
          (ObjDecoder *this,DecoderBuffer *buffer,PointCloud *out_point_cloud)

{
  char *data;
  DecoderBuffer *this_00;
  undefined8 in_RCX;
  DecoderBuffer *in_RDX;
  long in_RSI;
  Status *in_RDI;
  ObjDecoder *in_stack_00000588;
  
  *(undefined8 *)(in_RSI + 0x140) = in_RCX;
  data = (char *)(in_RSI + 0x100);
  this_00 = (DecoderBuffer *)DecoderBuffer::data_head(in_RDX);
  DecoderBuffer::remaining_size(in_RDX);
  DecoderBuffer::Init(this_00,data,0x11c20f);
  DecodeInternal(in_stack_00000588);
  return in_RDI;
}

Assistant:

Status ObjDecoder::DecodeFromBuffer(DecoderBuffer *buffer,
                                    PointCloud *out_point_cloud) {
  out_point_cloud_ = out_point_cloud;
  buffer_.Init(buffer->data_head(), buffer->remaining_size());
  return DecodeInternal();
}